

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O2

void __thiscall rcdiscover::DeviceInfo::clear(DeviceInfo *this)

{
  *(undefined8 *)((long)&this->mac + 4) = 0;
  this->subnet = 0;
  this->gateway = 0;
  this->major = 0;
  this->minor = 0;
  this->mac = 0;
  std::__cxx11::string::erase((ulong)&this->manufacturer_name,0);
  std::__cxx11::string::erase((ulong)&this->model_name,0);
  std::__cxx11::string::erase((ulong)&this->device_version,0);
  std::__cxx11::string::erase((ulong)&this->manufacturer_info,0);
  std::__cxx11::string::erase((ulong)&this->serial_number,0);
  std::__cxx11::string::erase((ulong)&this->user_name,0);
  return;
}

Assistant:

void DeviceInfo::clear()
{
  major=minor=0;
  mac=0;
  ip=0;
  subnet=0;
  gateway=0;

  manufacturer_name.erase();
  model_name.erase();
  device_version.erase();
  manufacturer_info.erase();
  serial_number.erase();
  user_name.erase();
}